

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall FPolyObj::UpdateLinks(FPolyObj *this)

{
  DVector2 *pDVar1;
  uint uVar2;
  line_t *plVar3;
  vertex_t *pvVar4;
  FLinePortal *pFVar5;
  uint uVar6;
  Node *pNVar7;
  Node *pNVar8;
  FLinePortal *pFVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> processed;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> local_68;
  double local_50;
  double local_48;
  DVector2 local_40;
  
  if (this->bHasPortals == '\x02') {
    local_68.NumUsed = 0;
    TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::SetNodeVector(&local_68,1);
    if ((this->Linedefs).Count != 0) {
      uVar10 = 0;
      do {
        uVar6 = linePortals.Count;
        pFVar5 = linePortals.Array;
        uVar2 = (this->Linedefs).Array[uVar10]->portalindex;
        if ((uVar2 < linePortals.Count) && ((linePortals.Array[uVar2].mFlags & 2) != 0)) {
          pFVar9 = linePortals.Array + uVar2;
          if (linePortals.Count <= uVar2) {
            pFVar9 = (FLinePortal *)0x0;
          }
          if (pFVar9->mType == '\x03') {
            local_50 = (pFVar9->mDisplacement).X;
            local_48 = (pFVar9->mDisplacement).Y;
            plVar3 = pFVar9->mDestination;
            pvVar4 = pFVar9->mOrigin->v1;
            dVar11 = (plVar3->v2->p).X - (pvVar4->p).X;
            dVar12 = (plVar3->v2->p).Y - (pvVar4->p).Y;
            (pFVar9->mDisplacement).Y = dVar12;
            (pFVar9->mDisplacement).X = dVar11;
            if (pFVar5 != (FLinePortal *)0x0 && plVar3->portalindex < uVar6) {
              pDVar1 = &pFVar5[plVar3->portalindex].mDisplacement;
              pDVar1->X = -dVar11;
              pDVar1->Y = -dVar12;
            }
            uVar2 = plVar3->frontsector->PortalGroup;
            pNVar8 = local_68.Nodes + (local_68.Size - 1 & uVar2);
            do {
              pNVar7 = pNVar8;
              if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
                pNVar7 = (Node *)0x0;
                break;
              }
              pNVar8 = pNVar7->Next;
            } while ((pNVar7->Pair).Key != uVar2);
            if ((pNVar7 == (Node *)0x0) || ((pNVar7->Pair).Value == false)) {
              pNVar8 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::GetNode
                                 (&local_68,uVar2);
              (pNVar8->Pair).Value = true;
              local_40.X = (pFVar9->mDisplacement).X - local_50;
              local_40.Y = (pFVar9->mDisplacement).Y - local_48;
              FDisplacementTable::MoveGroup(&Displacements,uVar2,&local_40);
            }
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (this->Linedefs).Count);
    }
    M_Free(local_68.Nodes);
  }
  return;
}

Assistant:

void FPolyObj::UpdateLinks()
{
	if (bHasPortals == 2)
	{
		TMap<int, bool> processed;
		for (unsigned i = 0; i < Linedefs.Size(); i++)
		{
			if (Linedefs[i]->isLinePortal())
			{
				FLinePortal *port = Linedefs[i]->getPortal();
				if (port->mType == PORTT_LINKED)
				{
					DVector2 old = port->mDisplacement;
					port->mDisplacement = port->mDestination->v2->fPos() - port->mOrigin->v1->fPos();
					FLinePortal *port2 = port->mDestination->getPortal();
					if (port2) port2->mDisplacement = -port->mDisplacement;
					int destgroup = port->mDestination->frontsector->PortalGroup;
					bool *done = processed.CheckKey(destgroup);
					if (!done || !*done)
					{
						processed[destgroup] = true;
						DVector2 delta = port->mDisplacement - old;
						Displacements.MoveGroup(destgroup, delta);
					}
				}
			}
		}
	}
}